

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall
bssl::select_ech_cipher_suite
          (bssl *this,EVP_HPKE_KDF **out_kdf,EVP_HPKE_AEAD **out_aead,
          Span<const_unsigned_char> cipher_suites,bool has_aes_hardware)

{
  Span<const_unsigned_char> span;
  int iVar1;
  size_t sVar2;
  EVP_HPKE_AEAD *pEVar3;
  EVP_HPKE_KDF *pEVar4;
  bool bVar5;
  EVP_HPKE_AEAD *candidate;
  uint16_t aead_id;
  EVP_HPKE_AEAD **ppEStack_60;
  uint16_t kdf_id;
  uchar *local_58;
  undefined1 local_50 [8];
  CBS cbs;
  EVP_HPKE_AEAD *aead;
  bool has_aes_hardware_local;
  EVP_HPKE_AEAD **out_aead_local;
  EVP_HPKE_KDF **out_kdf_local;
  Span<const_unsigned_char> cipher_suites_local;
  
  local_58 = cipher_suites.data_;
  cbs.len = 0;
  span.size_ = (size_t)local_58;
  span.data_ = (uchar *)out_aead;
  ppEStack_60 = out_aead;
  cbs_st::cbs_st((cbs_st *)local_50,span);
  while( true ) {
    sVar2 = CBS_len((CBS *)local_50);
    if (sVar2 == 0) {
      bVar5 = cbs.len != 0;
      if (bVar5) {
        pEVar4 = EVP_hpke_hkdf_sha256();
        *(EVP_HPKE_KDF **)this = pEVar4;
        *out_kdf = (EVP_HPKE_KDF *)cbs.len;
      }
      return bVar5;
    }
    iVar1 = CBS_get_u16((CBS *)local_50,(uint16_t *)((long)&candidate + 6));
    if ((iVar1 == 0) ||
       (iVar1 = CBS_get_u16((CBS *)local_50,(uint16_t *)((long)&candidate + 4)), iVar1 == 0)) break;
    pEVar3 = get_ech_aead(candidate._4_2_);
    if (((candidate._6_2_ == 1) && (pEVar3 != (EVP_HPKE_AEAD *)0x0)) &&
       ((cbs.len == 0 ||
        ((((undefined1  [16])cipher_suites & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (candidate._4_2_ == 3)))))) {
      cbs.len = (size_t)pEVar3;
    }
  }
  return false;
}

Assistant:

static bool select_ech_cipher_suite(const EVP_HPKE_KDF **out_kdf,
                                    const EVP_HPKE_AEAD **out_aead,
                                    Span<const uint8_t> cipher_suites,
                                    const bool has_aes_hardware) {
  const EVP_HPKE_AEAD *aead = nullptr;
  CBS cbs = cipher_suites;
  while (CBS_len(&cbs) != 0) {
    uint16_t kdf_id, aead_id;
    if (!CBS_get_u16(&cbs, &kdf_id) ||  //
        !CBS_get_u16(&cbs, &aead_id)) {
      return false;
    }
    // Pick the first common cipher suite, but prefer ChaCha20-Poly1305 if we
    // don't have AES hardware.
    const EVP_HPKE_AEAD *candidate = get_ech_aead(aead_id);
    if (kdf_id != EVP_HPKE_HKDF_SHA256 || candidate == nullptr) {
      continue;
    }
    if (aead == nullptr ||
        (!has_aes_hardware && aead_id == EVP_HPKE_CHACHA20_POLY1305)) {
      aead = candidate;
    }
  }
  if (aead == nullptr) {
    return false;
  }

  *out_kdf = EVP_hpke_hkdf_sha256();
  *out_aead = aead;
  return true;
}